

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O3

void tcg_gen_goto_tb_x86_64(TCGContext *tcg_ctx,uint idx)

{
  TCGOp *pTVar1;
  
  pTVar1 = tcg_emit_op_x86_64(tcg_ctx,INDEX_op_goto_tb);
  pTVar1->args[0] = (ulong)idx;
  return;
}

Assistant:

void tcg_gen_goto_tb(TCGContext *tcg_ctx, unsigned idx)
{
    /* We only support two chained exits.  */
    tcg_debug_assert(idx <= TB_EXIT_IDXMAX);
#ifdef CONFIG_DEBUG_TCG
    /* Verify that we havn't seen this numbered exit before.  */
    tcg_debug_assert((tcg_ctx->goto_tb_issue_mask & (1 << idx)) == 0);
    tcg_ctx->goto_tb_issue_mask |= 1 << idx;
#endif
    /* When not chaining, we simply fall through to the "fallback" exit.  */

    // if (!qemu_loglevel_mask(CPU_LOG_TB_NOCHAIN))
    tcg_gen_op1i(tcg_ctx, INDEX_op_goto_tb, idx);
}